

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetFloorScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int secnum;
  FSectorTagIterator itr;
  double yscale;
  double xscale;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  yscale = (double)arg1 + (double)arg2 / 100.0;
  itr = (FSectorTagIterator)((double)arg3 + (double)arg4 / 100.0);
  if ((yscale != 0.0) || (NAN(yscale))) {
    yscale = 1.0 / yscale;
  }
  if (((double)itr != 0.0) || (NAN((double)itr))) {
    itr = (FSectorTagIterator)(1.0 / (double)itr);
  }
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc0,arg0);
  while (iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc0),
        -1 < iVar1) {
    if ((yscale != 0.0) || (NAN(yscale))) {
      sector_t::SetXScale((sector_t *)(sectors + iVar1),0,yscale);
    }
    if (((double)itr != 0.0) || (NAN((double)itr))) {
      sector_t::SetYScale((sector_t *)(sectors + iVar1),0,(double)itr);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorScale)
// Sector_SetFloorScale (tag, x-int, x-frac, y-int, y-frac)
{
	double xscale = arg1 + arg2 / 100.;
	double yscale = arg3 + arg4 / 100.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (xscale)
			sectors[secnum].SetXScale(sector_t::floor, xscale);
		if (yscale)
			sectors[secnum].SetYScale(sector_t::floor, yscale);
	}
	return true;
}